

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O3

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<char[14],std::__cxx11::string>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,char (*v) [14],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  int iVar1;
  size_t sVar2;
  pointer pbVar3;
  long lVar4;
  
  pbVar3 = (sv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)((long)(sv->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
    lVar4 = idx << 5;
    do {
      iVar1 = ::std::__cxx11::string::compare((char *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4));
      if (iVar1 == 0) {
        sVar2 = strlen(*v);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)ss,*v,sVar2);
        format_sv_rec<std::__cxx11::string>
                  ((ostringstream *)ss,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)sv,idx + 1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        return ss;
      }
      pbVar3 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ss,*(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar4),
                 *(long *)((long)&pbVar3->_M_string_length + lVar4));
      idx = idx + 1;
      pbVar3 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (idx < (ulong)((long)(sv->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}